

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

void anon_unknown.dwarf_45453::replace(string *str,Product *product)

{
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RSI;
  subst *in_stack_00000120;
  string *in_stack_00000128;
  string *in_stack_00000130;
  allocator *__f;
  allocator local_31;
  string local_30 [32];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_10;
  
  __f = &local_31;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"product",__f);
  std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
  function<(anonymous_namespace)::replace(std::__cxx11::string&,Product_const&)::__0,void>
            (local_10,(anon_class_8_1_70e7ffcf *)__f);
  replace(in_stack_00000130,in_stack_00000128,in_stack_00000120);
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x25f884);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void replace(std::string& str, const Product& product) {
  replace(str, "product", [&] (const std::string& in) {
      if (in == "short") {
        return product.nameShort;
      } else if (in == "long") {
        return product.nameLong;
      }
      return std::string();
    });
}